

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O3

int green_loop_release(green_loop_t loop)

{
  int *piVar1;
  green_loop_t pgVar2;
  int iVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ucontext_t *puVar6;
  ucontext_t *puVar7;
  ulong in_RCX;
  undefined8 extraout_RDX;
  ucontext_t *in_RSI;
  green_coroutine_t pgVar8;
  green_coroutine_t __ptr;
  long in_R8;
  ulong uVar9;
  int iStack_ac;
  
  if (loop == (green_loop_t)0x0) {
    green_loop_release_cold_3();
LAB_00103eed:
    green_loop_release_cold_1();
  }
  else {
    iVar3 = loop->refs;
    if (iVar3 < 1) goto LAB_00103eed;
    in_RCX = (ulong)(iVar3 - 1U);
    loop->refs = iVar3 - 1U;
    if (iVar3 != 1) {
      return 0;
    }
    if (loop->coroutines == 0) {
      free(loop);
      return 0;
    }
  }
  green_loop_release_cold_2();
  if ((green_coroutine_t)loop == (green_coroutine_t)0x0) {
    _green_coroutine_init_cold_4();
    puVar7 = in_RSI;
    pgVar8 = (green_coroutine_t)loop;
LAB_00103fdc:
    _green_coroutine_init_cold_3();
LAB_00103fe1:
    _green_coroutine_init_cold_2();
  }
  else {
    puVar7 = in_RSI;
    pgVar8 = (green_coroutine_t)loop;
    if (in_RSI == (ucontext_t *)0x0) goto LAB_00103fdc;
    if (in_R8 == 0) goto LAB_00103fe1;
    puVar4 = (undefined8 *)green_malloc(0x400);
    *(undefined4 *)(puVar4 + 1) = 1;
    *puVar4 = loop;
    iVar3 = ((green_coroutine_t)loop)->refs;
    ((green_coroutine_t)loop)->refs = iVar3 + 1;
    *(int *)((long)puVar4 + 0xc) = iVar3;
    puVar4[2] = in_RSI;
    puVar4[3] = extraout_RDX;
    puVar4[4] = 0xffffffff00000000;
    puVar4[0x7f] = in_R8;
    pgVar8 = (green_coroutine_t)(puVar4 + 5);
    iVar3 = getcontext();
    if (iVar3 == 0) {
      uVar9 = 0x10000;
      if (in_RCX != 0) {
        uVar9 = in_RCX;
      }
      pvVar5 = green_malloc((int)uVar9);
      puVar4[0x7e] = pvVar5;
      puVar4[7] = pvVar5;
      puVar4[9] = uVar9;
      puVar4[6] = (ucontext_t *)&((green_coroutine_t)loop)->method;
      makecontext((green_coroutine_t)(puVar4 + 5),_coroutine,1,puVar4);
      piVar1 = (int *)((long)&((green_coroutine_t)loop)->loop + 4);
      *piVar1 = *piVar1 + 1;
      return (int)puVar4;
    }
  }
  _green_coroutine_init_cold_1();
  if (pgVar8 == (green_coroutine_t)0x0) {
    _coroutine_cold_5();
    __ptr = pgVar8;
LAB_0010404b:
    _coroutine_cold_4();
LAB_00104050:
    _coroutine_cold_1();
LAB_00104055:
    _coroutine_cold_2();
  }
  else {
    __ptr = (green_coroutine_t)pgVar8->loop;
    if (__ptr == (green_coroutine_t)0x0) goto LAB_0010404b;
    if ((green_coroutine_t)(__ptr->context).__ssp[1] != pgVar8) goto LAB_00104050;
    *(int *)&__ptr->loop = *(int *)&__ptr->loop + 1;
    pgVar8->refs = pgVar8->refs + 1;
    *(undefined4 *)&((ucontext_t *)&pgVar8->state)->__uc_flags = 1;
    puVar7 = (ucontext_t *)((ucontext_t *)&pgVar8->object)->__uc_flags;
    iVar3 = (*(code *)((ucontext_t *)&pgVar8->method)->__uc_flags)((green_loop_t)__ptr,puVar7);
    *(int *)&((ucontext_t *)&pgVar8->result)->__uc_flags = iVar3;
    pgVar2 = pgVar8->loop;
    if (pgVar2->currentcoro != pgVar8) goto LAB_00104055;
    if (*(int *)&((ucontext_t *)&pgVar8->state)->__uc_flags == 1) {
      *(undefined4 *)&((ucontext_t *)&pgVar8->state)->__uc_flags = 3;
      pgVar2->currentcoro = (green_coroutine_t)0x0;
      pgVar8->refs = pgVar8->refs + -1;
      pgVar2->refs = pgVar2->refs + -1;
      return (int)pgVar2;
    }
  }
  _coroutine_cold_3();
  if (__ptr == (green_coroutine_t)0x0) {
    _green_yield_cold_5();
LAB_001040b4:
    _green_yield_cold_1();
  }
  else {
    pgVar8 = (green_coroutine_t)(__ptr->context).__ssp[1];
    if ((pgVar8 != (green_coroutine_t)0x0) && (pgVar8->state != running)) goto LAB_001040b4;
    if (puVar7 == (ucontext_t *)0x0) {
      _green_yield_cold_4();
      return 0;
    }
    if (((puVar7->uc_stack).ss_size & 0xfffffffd) == 0) {
      _green_yield_cold_2();
      return 0;
    }
  }
  _green_yield_cold_3();
  if (__ptr == (green_coroutine_t)0x0) {
    green_coroutine_result_cold_2();
  }
  else if (*(int *)&((ucontext_t *)&__ptr->state)->__uc_flags == 3) {
    return *(int *)&((ucontext_t *)&__ptr->result)->__uc_flags;
  }
  green_coroutine_result_cold_1();
  if (__ptr != (green_coroutine_t)0x0) {
    __ptr->refs = __ptr->refs + 1;
    return 0;
  }
  green_coroutine_acquire_cold_1();
  if (__ptr == (green_coroutine_t)0x0) {
    green_coroutine_release_cold_3();
    pgVar8 = __ptr;
LAB_00104131:
    green_coroutine_release_cold_2();
  }
  else {
    pgVar8 = __ptr;
    if (__ptr->loop == (green_loop_t)0x0) goto LAB_00104131;
    piVar1 = &__ptr->refs;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      return 0;
    }
    pgVar8 = (green_coroutine_t)(((green_loop_t)((__ptr->context).__ssp + 2))->context).__uc_flags;
    if (pgVar8 != (green_coroutine_t)0x0) {
      free(pgVar8);
      (((green_loop_t)((__ptr->context).__ssp + 2))->context).__uc_flags = 0;
      piVar1 = &__ptr->loop->coroutines;
      *piVar1 = *piVar1 + -1;
      free(__ptr);
      return 0;
    }
  }
  green_coroutine_release_cold_1();
  if (puVar7 == (ucontext_t *)0x0 || pgVar8 == (green_coroutine_t)0x0) {
    puVar4 = (undefined8 *)0x0;
LAB_0010418b:
    return (int)puVar4;
  }
  if (0 < *(int *)&pgVar8->loop) {
    puVar4 = (undefined8 *)green_malloc(0x30);
    *puVar4 = pgVar8;
    *(undefined4 *)(puVar4 + 1) = 1;
    pvVar5 = green_malloc((int)puVar7 * 8);
    puVar4[2] = pvVar5;
    puVar4[4] = puVar7;
    goto LAB_0010418b;
  }
  green_poller_init_cold_1();
  if (pgVar8 == (green_coroutine_t)0x0) {
LAB_001041bd:
    puVar6 = (ucontext_t *)0x0;
LAB_001041bf:
    return (int)puVar6;
  }
  if (pgVar8->loop == (green_loop_t)0x0) {
    green_poller_size_cold_3();
  }
  else {
    puVar7 = (ucontext_t *)((ucontext_t *)&pgVar8->object)->__uc_flags;
    puVar6 = (ucontext_t *)((ucontext_t *)&pgVar8->state)->__uc_flags;
    if (puVar7 <= puVar6) {
      if ((ucontext_t *)(pgVar8->context).__uc_flags <= puVar7) goto LAB_001041bf;
      green_poller_size_cold_1();
      goto LAB_001041bd;
    }
  }
  green_poller_size_cold_2();
  if (pgVar8 != (green_coroutine_t)0x0) {
    if (pgVar8->loop == (green_loop_t)0x0) {
      green_poller_used_cold_3();
LAB_001041f5:
      green_poller_used_cold_2();
      if (pgVar8 == (green_coroutine_t)0x0) {
        return 0;
      }
      if (pgVar8->loop == (green_loop_t)0x0) {
        green_poller_done_cold_3();
      }
      else {
        puVar7 = (ucontext_t *)((ucontext_t *)&pgVar8->object)->__uc_flags;
        if (puVar7 <= (ucontext_t *)((ucontext_t *)&pgVar8->state)->__uc_flags) {
          if (puVar7 < (ucontext_t *)(pgVar8->context).__uc_flags) {
            green_poller_done_cold_1();
            return 0;
          }
          return (int)puVar7 - (int)(pgVar8->context).__uc_flags;
        }
      }
      green_poller_done_cold_2();
      if (pgVar8 == (green_coroutine_t)0x0) {
        return 1;
      }
      if (0 < pgVar8->refs) {
        pgVar8->refs = pgVar8->refs + 1;
        return 0;
      }
      green_poller_acquire_cold_1();
      if (pgVar8 == (green_coroutine_t)0x0) {
        return 1;
      }
      green_future_release_cold_1();
      return iStack_ac;
    }
    puVar7 = (ucontext_t *)((ucontext_t *)&pgVar8->object)->__uc_flags;
    if ((ucontext_t *)((ucontext_t *)&pgVar8->state)->__uc_flags < puVar7) goto LAB_001041f5;
    if ((ucontext_t *)(pgVar8->context).__uc_flags <= puVar7) goto LAB_001041ee;
    green_poller_used_cold_1();
  }
  puVar7 = (ucontext_t *)0x0;
LAB_001041ee:
  return (int)puVar7;
}

Assistant:

int green_loop_release(green_loop_t loop)
{
    green_assert(loop != NULL);
    green_assert(loop->refs > 0);

    if (--(loop->refs) > 0) {
        return GREEN_SUCCESS;
    }

    green_assert(loop != NULL);

    green_assert(loop->coroutines == 0);
    green_free(loop);

    return GREEN_SUCCESS;
}